

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O2

void __thiscall
UtestShell::assertUnsignedLongLongsEqual
          (UtestShell *this,cpputest_ulonglong expected,cpputest_ulonglong actual,char *text,
          char *fileName,int lineNumber,TestTerminator *testTerminator)

{
  TestResult *pTVar1;
  SimpleString local_78;
  TestFailure local_70;
  
  pTVar1 = getTestResult(this);
  (*pTVar1->_vptr_TestResult[10])(pTVar1);
  if (expected != actual) {
    SimpleString::SimpleString(&local_78,text);
    UnsignedLongLongsEqualFailure::UnsignedLongLongsEqualFailure
              ((UnsignedLongLongsEqualFailure *)&local_70,this,fileName,lineNumber,expected,actual,
               &local_78);
    (*this->_vptr_UtestShell[0x25])(this,&local_70,testTerminator);
    TestFailure::~TestFailure(&local_70);
    SimpleString::~SimpleString(&local_78);
  }
  return;
}

Assistant:

void UtestShell::assertUnsignedLongLongsEqual(cpputest_ulonglong expected, cpputest_ulonglong actual, const char* text, const char* fileName, int lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
#ifdef CPPUTEST_USE_LONG_LONG
    if (expected != actual)
        failWith(UnsignedLongLongsEqualFailure(this, fileName, lineNumber, expected, actual, text), testTerminator);
#else
    (void)expected;
    (void)actual;
    failWith(FeatureUnsupportedFailure(this, fileName, lineNumber, "CPPUTEST_USE_LONG_LONG", text), testTerminator);
#endif
}